

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O0

void __thiscall Timing::Save(Timing *this,ofstream *of)

{
  bool bVar1;
  void *pvVar2;
  pointer ppVar3;
  pointer pTVar4;
  ostream *poVar5;
  ostream *in_RSI;
  long in_RDI;
  const_iterator j;
  string *id;
  vector<Timing::Times,_std::allocator<Timing::Times>_> *times;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
  *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
  local_40;
  pointer local_38;
  vector<Timing::Times,_std::allocator<Timing::Times>_> *local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
  local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  pvVar2 = (void *)std::ostream::operator<<(in_RSI,*(long *)(in_RDI + 0x30));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
  ::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
             ::begin(in_stack_ffffffffffffff98);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
                           *)0x9fc019);
    local_30 = &ppVar3->second;
    local_38 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
                             *)0x9fc02c);
    local_40._M_current =
         (Times *)std::vector<Timing::Times,_std::allocator<Timing::Times>_>::begin
                            ((vector<Timing::Times,_std::allocator<Timing::Times>_> *)
                             in_stack_ffffffffffffff98);
    while( true ) {
      std::vector<Timing::Times,_std::allocator<Timing::Times>_>::end
                ((vector<Timing::Times,_std::allocator<Timing::Times>_> *)in_stack_ffffffffffffff98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      pTVar4 = __gnu_cxx::
               __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
               ::operator->(&local_40);
      if ((pTVar4->hasEnded & 1U) != 0) {
        poVar5 = std::operator<<(local_10,(string *)local_38);
        in_stack_ffffffffffffffa0 = std::operator<<(poVar5," ");
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                 ::operator->(&local_40);
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffa0,pTVar4->start);
        poVar5 = std::operator<<(poVar5," ");
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                 ::operator->(&local_40);
        pvVar2 = (void *)std::ostream::operator<<(poVar5,pTVar4->end);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
      ::operator++(&local_40);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
                  *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void Timing::Save(ofstream &of) const
{
    of << _m_timeAtInitialization << endl;

    map<string, vector<Times> >::const_iterator i;
    for(i=_m_timesMap.begin(); i!=_m_timesMap.end(); ++i)
    {
        const vector<Times> &times=i->second;
        const string &id=i->first;

        for(vector<Times>::const_iterator j=times.begin();
            j!=times.end();++j)
        {
            if(j->hasEnded)
                of << id << " " << j->start << " " << j->end << endl;
        }
    }
}